

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::IsInternallyOn(char *val)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  reference pcVar4;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string v;
  char *val_local;
  
  if (val == (char *)0x0) {
    val_local._7_1_ = false;
  }
  else {
    v.field_2._8_8_ = val;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,val,&local_39);
    std::allocator<char>::~allocator(&local_39);
    uVar3 = std::__cxx11::string::size();
    if (uVar3 < 5) {
      __end1._M_current = (char *)std::__cxx11::string::begin();
      c = (char *)std::__cxx11::string::end();
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&c);
        if (!bVar1) break;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1);
        iVar2 = toupper((int)*pcVar4);
        *pcVar4 = (char)iVar2;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1);
      }
      val_local._7_1_ =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_38,"I_ON");
    }
    else {
      val_local._7_1_ = false;
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  return val_local._7_1_;
}

Assistant:

bool cmSystemTools::IsInternallyOn(const char* val)
{
  if (!val) {
    return false;
  }
  std::string v = val;
  if (v.size() > 4) {
    return false;
  }

  for (char& c : v) {
    c = static_cast<char>(toupper(c));
  }
  return v == "I_ON";
}